

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_rstat(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  long in_RDI;
  __type_conflict2 _Var6;
  char ebuf [500];
  EXIT_DATA *pexit;
  EXIT_DATA **__end1;
  EXIT_DATA **__begin1;
  EXIT_DATA *(*__range1) [6];
  EXTRA_DESCR_DATA *ed;
  int time;
  int counter;
  int i;
  int door;
  char *direction;
  CHAR_DATA *rch;
  OBJ_DATA *obj;
  ROOM_INDEX_DATA *location;
  char arg [4608];
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffd918;
  char *in_stack_ffffffffffffd920;
  undefined4 in_stack_ffffffffffffd928;
  uint in_stack_ffffffffffffd92c;
  uint in_stack_ffffffffffffd930;
  uint in_stack_ffffffffffffd934;
  CHAR_DATA *in_stack_ffffffffffffd938;
  uint local_26a4;
  ROOM_INDEX_DATA *local_2670;
  char local_2668 [504];
  EXIT_DATA *local_2470;
  TRACK_DATA **local_2468;
  EXIT_DATA **local_2460;
  EXIT_DATA **local_2458;
  EXTRA_DESCR_DATA *local_2450;
  uint local_2448;
  int local_2444;
  int local_2440;
  uint local_243c;
  char *local_2438;
  CHAR_DATA *local_2430;
  OBJ_DATA *local_2428;
  ROOM_INDEX_DATA *local_2420;
  char local_2418;
  char *in_stack_ffffffffffffebb8;
  CHAR_DATA *in_stack_ffffffffffffebc0;
  char local_1218 [4624];
  long local_8;
  
  local_243c = 0;
  local_2440 = 0;
  local_2444 = 0;
  local_2448 = 0;
  local_8 = in_RDI;
  one_argument(in_stack_ffffffffffffd920,(char *)in_stack_ffffffffffffd918);
  if (local_2418 == '\0') {
    local_2670 = *(ROOM_INDEX_DATA **)(local_8 + 0xa8);
  }
  else {
    local_2670 = find_location((CHAR_DATA *)
                               CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928),
                               in_stack_ffffffffffffd920);
  }
  local_2420 = local_2670;
  if (local_2670 == (ROOM_INDEX_DATA *)0x0) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
  }
  else {
    bVar3 = is_room_owner(in_stack_ffffffffffffd918,(ROOM_INDEX_DATA *)0x5898fb);
    if ((((bVar3) || (*(ROOM_INDEX_DATA **)(local_8 + 0xa8) == local_2420)) ||
        (bVar3 = room_is_private(local_2420), !bVar3)) ||
       (bVar3 = is_trusted(in_stack_ffffffffffffd918,0), bVar3)) {
      sprintf(local_1218,"Name: \'%s\'\n\rArea: \'%s\'\n\r",local_2420->name,local_2420->area->name)
      ;
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      sVar1 = local_2420->vnum;
      iVar4 = sect_numlookup((int)local_2420->sector_type);
      pcVar5 = capitalize(sect_table[iVar4].name);
      sprintf(local_1218,"Vnum: %d  Sector: %s  Healing: %d%%  mana: %d%%\n\r",
              (ulong)(uint)(int)sVar1,pcVar5,(ulong)(uint)(int)local_2420->heal_rate,
              (ulong)(uint)(int)local_2420->mana_rate);
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      sprintf(local_1218,"Description:\n\r%s",local_2420->description);
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      if (local_2420->extra_descr != (EXTRA_DESCR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
        for (local_2450 = local_2420->extra_descr; local_2450 != (EXTRA_DESCR_DATA *)0x0;
            local_2450 = local_2450->next) {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
          if (local_2450->next != (EXTRA_DESCR_DATA *)0x0) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                         (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928))
            ;
          }
        }
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      }
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      for (local_2430 = local_2420->people; local_2430 != (CHAR_DATA *)0x0;
          local_2430 = local_2430->next_in_room) {
        bVar3 = can_see(in_stack_ffffffffffffd938,
                        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930));
        if (bVar3) {
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
          one_argument(in_stack_ffffffffffffd920,(char *)in_stack_ffffffffffffd918);
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
        }
      }
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      for (local_2428 = local_2420->contents; local_2428 != (OBJ_DATA *)0x0;
          local_2428 = local_2428->next_content) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
        one_argument(in_stack_ffffffffffffd920,(char *)in_stack_ffffffffffffd918);
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      }
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      local_2468 = local_2420->tracks;
      local_2460 = local_2420->exit;
      local_2458 = local_2460;
      for (; local_2460 != (EXIT_DATA **)local_2468; local_2460 = local_2460 + 1) {
        local_2470 = *local_2460;
        if (local_2470 != (EXIT_DATA *)0x0) {
          local_2668[0] = '\0';
          local_2440 = 0;
          while (exit_flags[local_2440].name != (char *)0x0) {
            uVar2 = local_2470->exit_info[(int)(exit_flags[local_2440].bit / 0x20)];
            _Var6 = std::pow<int,long>((int)((ulong)in_stack_ffffffffffffd920 >> 0x20),
                                       (long)in_stack_ffffffffffffd918);
            if ((uVar2 & (long)_Var6) != 0) {
              strcat(local_2668," ");
              strcat(local_2668,exit_flags[local_2440].name);
            }
            local_2440 = local_2440 + 1;
          }
          if ((local_2470->u1).to_room == (ROOM_INDEX_DATA *)0x0) {
            local_26a4 = 0xffffffff;
          }
          else {
            local_26a4 = (uint)((local_2470->u1).to_room)->vnum;
          }
          in_stack_ffffffffffffd918 = (CHAR_DATA *)local_2470->keyword;
          if (*local_2470->description == '\0') {
            in_stack_ffffffffffffd920 = "(none).\n\r";
          }
          else {
            in_stack_ffffffffffffd920 = local_2470->description;
          }
          sprintf(local_1218,
                  "Door: %d.  To: %d.  Key: %d.  Exit flags:%s.\n\rKeyword: \'%s\'.  Description: %s"
                  ,(ulong)local_243c,(ulong)local_26a4,(ulong)(uint)(int)local_2470->key,local_2668)
          ;
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
        }
        local_243c = local_243c + 1;
      }
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      for (local_2440 = 0; local_2440 < 4; local_2440 = local_2440 + 1) {
        if ((local_2420->tracks[local_2440] != (TRACK_DATA *)0x0) &&
           (local_2420->tracks[local_2440]->prey != (CHAR_DATA *)0x0)) {
          if (time_info.hour < (local_2420->tracks[local_2440]->time).hour) {
            if (((time_info.hour + 0x18) - (local_2420->tracks[local_2440]->time).hour) +
                (uint)((local_2420->tracks[local_2440]->time).day <= time_info.day) == 0) {
              if (((time_info.day + 0x1e) - (local_2420->tracks[local_2440]->time).day) * 0x18 +
                  (uint)((local_2420->tracks[local_2440]->time).month <= time_info.month) == 0) {
                in_stack_ffffffffffffd92c =
                     ((time_info.month + 0xc) - (local_2420->tracks[local_2440]->time).month) *
                     0x2d0 + (time_info.year - (local_2420->tracks[local_2440]->time).year) * 0x21c0
                ;
                in_stack_ffffffffffffd930 = in_stack_ffffffffffffd92c;
                in_stack_ffffffffffffd934 = in_stack_ffffffffffffd92c;
              }
              else {
                in_stack_ffffffffffffd92c =
                     (time_info.month - (local_2420->tracks[local_2440]->time).month) * 0x2d0;
                in_stack_ffffffffffffd930 = in_stack_ffffffffffffd92c;
                in_stack_ffffffffffffd934 = in_stack_ffffffffffffd92c;
              }
            }
            else {
              in_stack_ffffffffffffd930 =
                   (time_info.day - (local_2420->tracks[local_2440]->time).day) * 0x18;
              in_stack_ffffffffffffd934 = in_stack_ffffffffffffd930;
            }
          }
          else {
            in_stack_ffffffffffffd934 = time_info.hour - (local_2420->tracks[local_2440]->time).hour
            ;
          }
          local_2448 = in_stack_ffffffffffffd934;
          local_2438 = flag_name_lookup(CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928
                                                ),(flag_type *)in_stack_ffffffffffffd920);
          sprintf(local_1218,"%s exited to the %s %d hours ago.\n\r",
                  local_2420->tracks[local_2440]->prey->name,local_2438,(ulong)local_2448);
          send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
          local_2444 = local_2444 + 1;
        }
      }
      if (local_2444 == 0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
      }
      do_raffects(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
    }
    else {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffd934,in_stack_ffffffffffffd930),
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffd92c,in_stack_ffffffffffffd928));
    }
  }
  return;
}

Assistant:

void do_rstat(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char arg[MAX_INPUT_LENGTH];
	ROOM_INDEX_DATA *location;
	OBJ_DATA *obj;
	CHAR_DATA *rch;
	char *direction;
	int door = 0, i = 0, counter = 0, time = 0;

	one_argument(argument, arg);

	location = (arg[0] == '\0') ? ch->in_room : find_location(ch, arg);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, location)
		&& ch->in_room != location
		&& room_is_private(location)
		&& !is_trusted(ch, IMPLEMENTOR))
	{
		send_to_char("That room is private right now.\n\r", ch);
		return;
	}

	sprintf(buf, "Name: '%s'\n\rArea: '%s'\n\r", location->name, location->area->name);
	send_to_char(buf, ch);

	sprintf(buf, "Vnum: %d  Sector: %s  Healing: %d%%  mana: %d%%\n\r",
		location->vnum,
		capitalize(sect_table[sect_numlookup(location->sector_type)].name),
		location->heal_rate,
		location->mana_rate);
	send_to_char(buf, ch);

	sprintf(buf, "Description:\n\r%s", location->description);
	send_to_char(buf, ch);

	if (location->extra_descr != nullptr)
	{
		EXTRA_DESCR_DATA *ed;

		send_to_char("Extra description keywords: '", ch);

		for (ed = location->extra_descr; ed; ed = ed->next)
		{
			send_to_char(ed->keyword, ch);
			if (ed->next != nullptr)
				send_to_char(" ", ch);
		}

		send_to_char("'.\n\r", ch);
	}

	send_to_char("Characters:", ch);
	for (rch = location->people; rch; rch = rch->next_in_room)
	{
		if (can_see(ch, rch))
		{
			send_to_char(" ", ch);
			one_argument(rch->name, buf);
			send_to_char(buf, ch);
		}
	}

	send_to_char(".\n\rObjects:   ", ch);

	for (obj = location->contents; obj; obj = obj->next_content)
	{
		send_to_char(" ", ch);
		one_argument(obj->name, buf);
		send_to_char(buf, ch);
	}

	send_to_char(".\n\r", ch);

	for(auto pexit : location->exit)
	{
		char ebuf[500];

		if (pexit != nullptr)
		{
			ebuf[0] = '\0';

			for (i = 0; exit_flags[i].name != nullptr; i++)
			{
				if (IS_SET(pexit->exit_info, exit_flags[i].bit))
				{
					strcat(ebuf, " ");
					strcat(ebuf, exit_flags[i].name);
				}
			}

			sprintf(buf, "Door: %d.  To: %d.  Key: %d.  Exit flags:%s.\n\rKeyword: '%s'.  Description: %s",
				door,
				(pexit->u1.to_room == nullptr ? -1 : pexit->u1.to_room->vnum),
				pexit->key,
				ebuf,
				pexit->keyword,
				pexit->description[0] != '\0' ? pexit->description : "(none).\n\r");
			send_to_char(buf, ch);
		}

		door++;
	}

	send_to_char("Characters who have passed through:\n\r", ch);
	for (i = 0; i < MAX_TRACKS; i++)
	{
		if (location->tracks[i] && location->tracks[i]->prey)
		{
			time = (time_info.hour >= location->tracks[i]->time.hour)
					   ? (time_info.hour - location->tracks[i]->time.hour)
					   : (24 + time_info.hour - location->tracks[i]->time.hour) +
								 (time_info.day >= location->tracks[i]->time.day)
							 ? 24 * (time_info.day - location->tracks[i]->time.day)
							 : 24 * (30 + time_info.day - location->tracks[i]->time.day) +
									   (time_info.month >= location->tracks[i]->time.month)
								   ? 24 * 30 * (time_info.month - location->tracks[i]->time.month)
								   : 24 * 30 * (12 + time_info.month - location->tracks[i]->time.month) +
										 24 * 30 * 12 * (time_info.year - location->tracks[i]->time.year);

			direction = flag_name_lookup(location->tracks[i]->direction, direction_table);

			sprintf(buf, "%s exited to the %s %d hours ago.\n\r", location->tracks[i]->prey->name, direction, time);
			send_to_char(buf, ch);

			counter++;
		}
	}

	if (counter == 0)
		send_to_char("None!\n\r", ch);

	do_raffects(ch, "");
}

void do_ostat(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH], arg[MAX_INPUT_LENGTH], buf2[MSL];
	OBJ_AFFECT_DATA *paf;
	OBJ_APPLY_DATA *app;
	AFFECT_DATA *paf2;
	OBJ_DATA *obj;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Stat what?\n\r", ch);
		return;
	}

	obj = get_obj_world(ch, argument);

	if (obj == nullptr || (obj && obj->carried_by && !can_see(ch, obj->carried_by)))
	{
		send_to_char("Nothing like that in hell, earth, or heaven.\n\r", ch);
		return;
	}

	sprintf(buf, "Name(s): %s\n\r", obj->name);
	send_to_char(buf, ch);

	sprintf(buf, "Vnum: %d  Format: %s  Type: %s  Resets: %d\n\r",
		obj->pIndexData->vnum,
		obj->pIndexData->new_format ? "new" : "old",
		item_name_lookup(obj->item_type),
		obj->pIndexData->reset_num);
	send_to_char(buf, ch);

	sprintf(buf, "Short description: %s\n\rLong description: %s\n\r", obj->short_descr, obj->description);
	send_to_char(buf, ch);

	sprintf(buf, "Owner: %s\n\r", obj->owner);
	send_to_char(buf, ch);

	sprintf(buf, "Wear bits: %s\n\rExtra bits: %s\n\r",
		wear_bit_name(obj->wear_flags),
		extra_bit_name(obj->extra_flags));
	send_to_char(buf, ch);

	sprintf(buf, "Restrict_flags: %s\n\r", restrict_bit_name(obj->pIndexData->restrict_flags));
	send_to_char(buf, ch);

	sprintf(buf, "Number: %d/%d  Weight: %d/%d/%d pounds  Material: %s  Mat Index: %d\n\r",
		1,
		get_obj_number(obj),
		obj->weight,
		get_obj_weight(obj),
		get_true_weight(obj),
		obj->material,
		obj->pIndexData->material_index);
	send_to_char(buf, ch);

	sprintf(buf, "Level: %d  Cost: %d  Condition: %d  Timer: %d\n\r",
		obj->level,
		obj->cost,
		obj->condition,
		obj->timer);
	send_to_char(buf, ch);

	sprintf(buf, "In room: %d  In object: %s  Carried by: %s  Wear_loc: %d\n\r",
		obj->in_room == nullptr ? 0 : obj->in_room->vnum,
		obj->in_obj == nullptr ? "(none)" : obj->in_obj->short_descr,
		obj->carried_by == nullptr ? "(none)" : can_see(ch, obj->carried_by) ? obj->carried_by->name : "someone",
		obj->wear_loc);
	send_to_char(buf, ch);

	sprintf(buf, "Values: %d %d %d %d %d\n\r",
		obj->value[0],
		obj->value[1],
		obj->value[2],
		obj->value[3],
		obj->value[4]);
	send_to_char(buf, ch);

	/* Report object limit and count and say if maxxed */
	sprintf(buf, "COUNT_DATA: Limit is %d, Count is %d -->%s.\n\r",
		obj->pIndexData->limtotal,
		obj->pIndexData->limcount,
		obj->pIndexData->limcount < obj->pIndexData->limtotal
			? "Not maxxed"
			: obj->pIndexData->limtotal == 0 ? "Non-limited" : "Maxxed");
	send_to_char(buf, ch);

	/* now give out vital statistics as per identify */

	switch (obj->item_type)
	{
		case ITEM_SCROLL:
		case ITEM_POTION:
		case ITEM_PILL:
			sprintf(buf, "Level %d spells of:", obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[1] >= 0 && obj->value[1] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[1]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[2] >= 0 && obj->value[2] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[2]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			if (obj->value[4] >= 0 && obj->value[4] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[4]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_WAND:
		case ITEM_STAFF:
			sprintf(buf, "Has %d(%d) charges of level %d", obj->value[1], obj->value[2], obj->value[0]);
			send_to_char(buf, ch);

			if (obj->value[3] >= 0 && obj->value[3] < MAX_SKILL)
			{
				send_to_char(" '", ch);
				send_to_char(skill_table[obj->value[3]].name, ch);
				send_to_char("'", ch);
			}

			send_to_char(".\n\r", ch);
			break;
		case ITEM_DRINK_CON:
			sprintf(buf, "It holds %s-colored %s.\n\r",
				liq_table[obj->value[2]].liq_color,
				liq_table[obj->value[2]].liq_name);
			send_to_char(buf, ch);
			break;
		case ITEM_WEAPON:
			send_to_char("Weapon type is ", ch);

			switch (obj->value[0])
			{
				case WEAPON_EXOTIC:
					send_to_char("exotic\n\r", ch);
					break;
				case WEAPON_SWORD:
					send_to_char("sword\n\r", ch);
					break;
				case WEAPON_DAGGER:
					send_to_char("dagger\n\r", ch);
					break;
				case WEAPON_SPEAR:
					send_to_char("spear\n\r", ch);
					break;
				case WEAPON_MACE:
					send_to_char("mace\n\r", ch);
					break;
				case WEAPON_AXE:
					send_to_char("axe\n\r", ch);
					break;
				case WEAPON_FLAIL:
					send_to_char("flail\n\r", ch);
					break;
				case WEAPON_WHIP:
					send_to_char("whip\n\r", ch);
					break;
				case WEAPON_POLEARM:
					send_to_char("polearm\n\r", ch);
					break;
				case WEAPON_STAFF:
					send_to_char("staff.\n\r", ch);
					break;
				default:
					send_to_char("unknown\n\r", ch);
					break;
			}

			if (obj->pIndexData->new_format)
			{
				sprintf(buf, "Damage is %dd%d (average %d)\n\r",
					obj->value[1],
					obj->value[2],
					(1 + obj->value[2]) * obj->value[1] / 2);
			}
			else
			{
				sprintf(buf, "Damage is %d to %d (average %d)\n\r",
					obj->value[1],
					obj->value[2],
					(obj->value[1] + obj->value[2]) / 2);
			}
			send_to_char(buf, ch);

			sprintf(buf, "Damage noun is %s.\n\r",
				(obj->value[3] > 0 && obj->value[3] < MAX_DAMAGE_MESSAGE)
					? attack_table[obj->value[3]].noun
					: "undefined");
			send_to_char(buf, ch);

			if (obj->value[4]) /* weapon flags */
			{
				sprintf(buf, "Weapons flags: %s\n\r", weapon_bit_name(obj->value[4]));
				send_to_char(buf, ch);
			}
			break;
		case ITEM_ARMOR:
			sprintf(buf, "Armor class is %d pierce, %d bash, %d slash, and %d vs. magic\n\r",
				obj->value[0],
				obj->value[1],
				obj->value[2],
				obj->value[3]);
			send_to_char(buf, ch);
			break;
		case ITEM_CORPSE_NPC:
		case ITEM_CORPSE_PC:
			sprintf(buf, "Original HP: %d  Owner: %s  Killed by: %s\n\r",
				obj->ohp,
				obj->owner,
				obj->talked);
			send_to_char(buf, ch);
			break;
		case ITEM_CONTAINER:
			sprintf(buf, "Capacity: %d#  Maximum weight: %d#  flags: %s\n\r",
				obj->value[0],
				obj->value[3],
				cont_bit_name(obj->value[1]));
			send_to_char(buf, ch);
			break;
	}

	if (obj->pIndexData->notes)
	{
		sprintf(buf, "NOTES: %s\n\r", obj->pIndexData->notes);
		send_to_char(buf, ch);
	}

	if (obj->extra_descr != nullptr || obj->pIndexData->extra_descr != nullptr)
	{
		EXTRA_DESCR_DATA *ed, *ed2;
		bool duplicate = false; /* Don't duplicate extradescs. */

		send_to_char("Extra description keywords: '", ch);

		for (ed = obj->extra_descr; ed != nullptr; ed = ed->next)
		{
			send_to_char(ed->keyword, ch);

			if (ed->next != nullptr)
				send_to_char(" ", ch);
		}

		for (ed = obj->pIndexData->extra_descr; ed != nullptr; ed = ed->next)
		{
			for (ed2 = obj->extra_descr; ed2; ed2 = ed2->next)
			{
				if (!str_cmp(ed->keyword, ed2->keyword))
					duplicate = true;
			}

			if (duplicate)
				continue;

			send_to_char(ed->keyword, ch);

			if (ed->next != nullptr)
				send_to_char(" ", ch);
		}

		send_to_char("'\n\r", ch);
	}

	if (obj->pIndexData->progtypes != 0)
	{
		if (IS_SET(obj->progtypes, IPROG_WEAR))
		{
			sprintf(buf, "Item has wear prog: %s\n\r", obj->pIndexData->iprogs->wear_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_REMOVE))
		{
			sprintf(buf, "Item has remove prog: %s\n\r", obj->pIndexData->iprogs->remove_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_GET))
		{
			sprintf(buf, "Item has get prog: %s\n\r", obj->pIndexData->iprogs->get_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_DROP))
		{
			sprintf(buf, "Item has drop prog: %s\n\r", obj->pIndexData->iprogs->drop_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_SAC))
		{
			sprintf(buf, "Item has sacrifice prog: %s\n\r", obj->pIndexData->iprogs->sac_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_GIVE))
		{
			sprintf(buf, "Item has give prog: %s\n\r", obj->pIndexData->iprogs->give_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_FIGHT))
		{
			sprintf(buf, "Item has fight prog: %s\n\r", obj->pIndexData->iprogs->fight_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_DEATH))
		{
			sprintf(buf, "Item has death prog: %s\n\r", obj->pIndexData->iprogs->death_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_SPEECH))
		{
			sprintf(buf, "Item has speech prog: %s\n\r", obj->pIndexData->iprogs->speech_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_PULSE))
		{
			sprintf(buf, "Item has pulse prog: %s\n\r", obj->pIndexData->iprogs->pulse_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_ENTRY))
		{
			sprintf(buf, "Item has entry prog: %s\n\r", obj->pIndexData->iprogs->entry_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_INVOKE))
		{
			sprintf(buf, "Item has invoke prog: %s\n\r", obj->pIndexData->iprogs->invoke_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_GREET))
		{
			sprintf(buf, "Item has greet prog: %s\n\r", obj->pIndexData->iprogs->greet_name);
			send_to_char(buf, ch);
		}

		if (IS_SET(obj->progtypes, IPROG_VERB))
		{
			sprintf(buf, "Item has verb prog: %s\n\r", obj->pIndexData->iprogs->verb_name);
			send_to_char(buf, ch);
		}
	}

	if (obj->pIndexData->spec_prog.func)
	{
		int i;
		long x;

		for (i = 0; ispec_table[i].spec_name; i++)
		{
			if (ispec_table[i].spec_func == obj->pIndexData->spec_prog.func)
				break;
		}

		if (!ispec_table[i].spec_name)
		{
			RS.Logger.Warn("Error: Invalid ispec.");
			return;
		}

		sprintf(buf, "Item has special prog: %s\n\r", ispec_table[i].spec_name);
		send_to_char(buf, ch);
		send_to_char("Item traps on: ", ch);

		for (x = 1; x < 1073741824; x = x * 2)
		{
			if (ispec_table[i].spec_events & x)
			{
				send_to_char(flag_name_lookup(x, ievent_table), ch);
				send_to_char(" ", ch);
			}
		}

		send_to_char("\n\r", ch);
	}

	if (obj->pIndexData->wear_echo[0] != nullptr)
	{
		sprintf(buf, "Item echos to wearer: %s\n\r", obj->pIndexData->wear_echo[0]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->wear_echo[1] != nullptr)
	{
		sprintf(buf, "Item echos to room on wear: %s\n\r", obj->pIndexData->wear_echo[1]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->remove_echo[0] != nullptr)
	{
		sprintf(buf, "Item echos to remover: %s\n\r", obj->pIndexData->remove_echo[0]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->remove_echo[1] != nullptr)
	{
		sprintf(buf, "Item echos to room on remove: %s\n\r", obj->pIndexData->remove_echo[1]);
		send_to_char(buf, ch);
	}

	if (obj->pIndexData->wear_loc_name != nullptr)
	{
		sprintf(buf, "Item has cosmetic wear location: worn \"%s\"\n\r", obj->pIndexData->wear_loc_name);
		send_to_char(buf, ch);
	}

	for (app = obj->apply; app; app = app->next)
	{
		sprintf(buf, "Modifies %s by %d.\n\r", affect_loc_name(app->location), app->modifier);
		send_to_char(buf, ch);
	}

	if (!IS_ZERO_VECTOR(obj->imm_flags))
	{
		sprintf(buf, "Grants immunity to: %s\n\r", imm_bit_name(obj->imm_flags));
		send_to_char(buf, ch);
	}

	if (!IS_ZERO_VECTOR(obj->res_flags))
	{
		sprintf(buf, "Grants resistance to: %s\n\r", imm_bit_name(obj->res_flags));
		send_to_char(buf, ch);
	}

	if (!IS_ZERO_VECTOR(obj->vuln_flags))
	{
		sprintf(buf, "Afflicts with vulnerability to: %s\n\r", imm_bit_name(obj->vuln_flags));
		send_to_char(buf, ch);
	}

	if (obj->wear_loc_name)
	{
		sprintf(buf, "Item is <worn %s>.\n\r", obj->wear_loc_name);
		send_to_char(buf, ch);
	}

	for (paf2 = obj->charaffs; paf2; paf2 = paf2->next)
	{
		if (paf2->bitvector)
		{
			sprintf(buf, "Imbues wearer with %s.\n\r", affect_bit_name(paf2->bitvector));
			send_to_char(buf, ch);
		}
	}

	for (paf = obj->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->aftype == AFT_SKILL)
			sprintf(buf2, "Skill");
		else if (paf->aftype == AFT_POWER)
			sprintf(buf2, "Power");
		else if (paf->aftype == AFT_COMMUNE)
			sprintf(buf2, "Commune");
		else if (paf->aftype == AFT_RUNE)
			sprintf(buf2, "Rune");
		else
			sprintf(buf2, "Spell");

		auto buffer = fmt::sprintf(buf, "%s: '%s' modifies %s by %d for %d%s hours with %s-bits %s, owner %s, level %d.\n\r",
			buf2,
			skill_table[(int)paf->type].name,
			(paf->where == TO_OBJ_AFFECTS)
				? str_cmp(oaffect_loc_name(paf->location), "none")
					? oaffect_loc_name(paf->location)
					: (paf->where == TO_OBJ_APPLY)
						? affect_loc_name(paf->location)
						: apply_locations[paf->location].name
				: "none",
			paf->modifier,
			(paf->duration == -1) ? -1 : (paf->duration / 2) + 1,
			(paf->duration == 0) ? "" : (paf->duration == -1) ? "" : ".5",
			(paf->where == TO_OBJ_AFFECTS) ? "aff" : (paf->where == TO_OBJ_APPLY) ? "apply" : "?",
			oaffect_bit_name(paf->bitvector),
			(paf->owner) ? paf->owner->name : "none", paf->level);
		send_to_char(buffer.c_str(), ch);
	}
}